

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void match_and_run(Am_Object *cmd_or_inter,Am_Object *match_command)

{
  Am_Object this;
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  void *pvVar5;
  Am_Wrapper *in_value;
  Am_Object local_98;
  Am_Object widget;
  Am_Object script_execute_command;
  Am_Inter_Location loc;
  Am_Value cmd_value;
  Am_Value current_value;
  Am_Value target_value;
  Am_Am_Slot_Key slot;
  Am_Object start_object;
  Am_Value_List slots_to_match;
  Am_Object local_20;
  Am_Object orig_command;
  Am_Object *match_command_local;
  Am_Object *cmd_or_inter_local;
  
  orig_command.data = (Am_Object_Data *)match_command;
  pAVar3 = Am_Object::Get(match_command,Am_ORIG_COMMAND,0);
  Am_Object::Am_Object(&local_20,pAVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"Match command ");
  poVar4 = operator<<(poVar4,(Am_Object *)orig_command.data);
  poVar4 = std::operator<<(poVar4," cmd_or_inter ");
  poVar4 = operator<<(poVar4,cmd_or_inter);
  poVar4 = std::operator<<(poVar4," orig_command ");
  poVar4 = operator<<(poVar4,&local_20);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  pAVar3 = Am_Object::Peek((Am_Object *)orig_command.data,0xf7,0);
  bVar1 = Am_Value::Valid(pAVar3);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Exiting because recursive\n");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  }
  else {
    pAVar3 = Am_Object::Get((Am_Object *)orig_command.data,0xb8,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)&start_object,pAVar3);
    pAVar3 = Am_Object::Peek(cmd_or_inter,0x11a,0);
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffb8,pAVar3);
    Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)((long)&target_value.value + 6),0);
    Am_Value::Am_Value((Am_Value *)&current_value.value);
    Am_Value::Am_Value((Am_Value *)&cmd_value.value);
    Am_Value::Am_Value((Am_Value *)&loc);
    Am_Value_List::Start((Am_Value_List *)&start_object);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)&start_object), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&start_object);
      Am_Am_Slot_Key::operator=((Am_Am_Slot_Key *)((long)&target_value.value + 6),pAVar3);
      this = orig_command;
      AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                        ((Am_Am_Slot_Key *)((long)&target_value.value + 6));
      pAVar3 = Am_Object::Peek((Am_Object *)this.data,AVar2,0);
      Am_Value::operator=((Am_Value *)&current_value.value,pAVar3);
      Am_Value::operator=((Am_Value *)&cmd_value.value,&Am_No_Value);
      bVar1 = Am_Value::Valid((Am_Value *)&current_value.value);
      if (bVar1) {
        bVar1 = Am_Object::Valid((Am_Object *)&stack0xffffffffffffffb8);
        if (bVar1) {
          bVar1 = Am_Am_Slot_Key::operator==
                            ((Am_Am_Slot_Key *)((long)&target_value.value + 6),
                             Am_LOCATION_PLACEHOLDER);
          if (bVar1) {
            Am_Inter_Location::Am_Inter_Location
                      ((Am_Inter_Location *)&script_execute_command,
                       (Am_Object *)&stack0xffffffffffffffb8);
            in_value = Am_Inter_Location::operator_cast_to_Am_Wrapper_
                                 ((Am_Inter_Location *)&script_execute_command);
            Am_Value::operator=((Am_Value *)&cmd_value.value,in_value);
            Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&script_execute_command);
          }
          else {
            AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                              ((Am_Am_Slot_Key *)((long)&target_value.value + 6));
            pAVar3 = Am_Object::Peek((Am_Object *)&stack0xffffffffffffffb8,AVar2,0);
            Am_Value::operator=((Am_Value *)&cmd_value.value,pAVar3);
          }
        }
        bVar1 = Am_Value::Valid((Am_Value *)&cmd_value.value);
        if (!bVar1) {
          AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                            ((Am_Am_Slot_Key *)((long)&target_value.value + 6));
          pAVar3 = Am_Object::Peek(&local_20,AVar2,0);
          Am_Value::operator=((Am_Value *)&cmd_value.value,pAVar3);
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"  Matching slot ");
      poVar4 = operator<<(poVar4,(Am_Am_Slot_Key *)((long)&target_value.value + 6));
      poVar4 = std::operator<<(poVar4," target `");
      poVar4 = operator<<(poVar4,(Am_Value *)&current_value.value);
      poVar4 = std::operator<<(poVar4,"\' cmd value `");
      poVar4 = operator<<(poVar4,(Am_Value *)&cmd_value.value);
      poVar4 = std::operator<<(poVar4,"\'\n");
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      bVar1 = Am_Value::Valid((Am_Value *)&current_value.value);
      if (((bVar1) && (bVar1 = Am_Value::Valid((Am_Value *)&cmd_value.value), bVar1)) &&
         (bVar1 = match_value_or_list((Am_Value *)&current_value.value,(Am_Value *)&cmd_value.value)
         , !bVar1)) goto LAB_002b6cfd;
      Am_Value_List::Next((Am_Value_List *)&start_object);
    }
    Am_Object::Set((Am_Object *)orig_command.data,0xf7,true,1);
    pAVar3 = Am_Object::Get((Am_Object *)orig_command.data,Am_SCRIPT_EXECUTE_COMMAND,0);
    Am_Object::Am_Object(&widget,pAVar3);
    pAVar3 = Am_Object::Get((Am_Object *)orig_command.data,Am_WIDGET_FOR_COMMAND,0);
    Am_Object::Am_Object(&local_98,pAVar3);
    poVar4 = std::operator<<((ostream *)&std::cout,"%% Calling ");
    poVar4 = operator<<(poVar4,&widget);
    poVar4 = std::operator<<(poVar4," for widget ");
    poVar4 = operator<<(poVar4,&local_98);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
    Am_Execute_Command(&widget,&local_98);
    Am_Object::Set((Am_Object *)orig_command.data,0xf7,false,0);
    Am_Object::~Am_Object(&local_98);
    Am_Object::~Am_Object(&widget);
LAB_002b6cfd:
    Am_Value::~Am_Value((Am_Value *)&loc);
    Am_Value::~Am_Value((Am_Value *)&cmd_value.value);
    Am_Value::~Am_Value((Am_Value *)&current_value.value);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffb8);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&start_object);
  }
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
match_and_run(Am_Object &cmd_or_inter, Am_Object &match_command)
{
  Am_Object orig_command = match_command.Get(Am_ORIG_COMMAND);
  std::cout << "Match command " << match_command << " cmd_or_inter "
            << cmd_or_inter << " orig_command " << orig_command << std::endl
            << std::flush;
  //check for recursive call
  if (match_command.Peek(Am_RUNNING).Valid()) {
    std::cout << "Exiting because recursive\n" << std::flush;
    return;
  }
  Am_Value_List slots_to_match = match_command.Get(Am_SLOTS_TO_SAVE);
  Am_Object start_object = cmd_or_inter.Peek(Am_START_OBJECT);
  Am_Am_Slot_Key slot;
  Am_Value target_value, current_value, cmd_value;
  for (slots_to_match.Start(); !slots_to_match.Last(); slots_to_match.Next()) {
    slot = slots_to_match.Get();
    target_value = match_command.Peek(slot);
    current_value = Am_No_Value;
    if (target_value.Valid()) {
      if (start_object.Valid()) {
        if (slot == Am_LOCATION_PLACEHOLDER) {
          Am_Inter_Location loc(start_object);
          current_value = loc;
        } else
          current_value = start_object.Peek(slot);
      }
      if (!current_value.Valid())
        current_value = orig_command.Peek(slot);
    }
    std::cout << "  Matching slot " << slot << " target `" << target_value
              << "' cmd value `" << current_value << "'\n"
              << std::flush;
    if (target_value.Valid() && current_value.Valid()) {
      if (!match_value_or_list(target_value, current_value))
        return; //doesn't match
    }
  }

  // if get here, then matches, so execute the script
  match_command.Set(Am_RUNNING, true, Am_OK_IF_NOT_THERE);
  Am_Object script_execute_command =
      match_command.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Object widget = match_command.Get(Am_WIDGET_FOR_COMMAND);
  std::cout << "%% Calling " << script_execute_command << " for widget "
            << widget << std::endl
            << std::flush;
  Am_Execute_Command(script_execute_command, widget);
  match_command.Set(Am_RUNNING, false);
}